

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree.cpp
# Opt level: O0

void calculate_factors(int *factors,int num_dims,int *stencil,int stencil_size)

{
  int i;
  int d;
  int stencil_size_local;
  int *stencil_local;
  int num_dims_local;
  int *factors_local;
  
  for (d = 0; d < num_dims; d = d + 1) {
    factors[d] = 0;
    for (i = 0; i < stencil_size; i = i + 1) {
      if (stencil[i * num_dims + d] != 0) {
        factors[d] = factors[d] + 1;
      }
    }
  }
  return;
}

Assistant:

void calculate_factors(int *factors, int num_dims, const int *stencil, int stencil_size) {
    for (int d = 0; d < num_dims; d++) {
        factors[d] = 0;
        for (int i = 0; i < stencil_size; ++i) {

            if (stencil[(i * num_dims) + d] != 0) {
                factors[d]++;
            }
        }
    }
}